

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGlitch.c
# Opt level: O0

void Gli_ManSetPiRandom(Gli_Man_t *p,float PiTransProb)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  int local_28;
  int i;
  float Multi;
  Gli_Obj_t *pObj;
  float PiTransProb_local;
  Gli_Man_t *p_local;
  
  if ((0.0 < PiTransProb) && (PiTransProb < 1.0)) {
    Vec_IntClear(p->vCisChanged);
    local_28 = 0;
    while( true ) {
      iVar1 = Vec_IntSize(p->vCis);
      bVar3 = false;
      if (local_28 < iVar1) {
        iVar1 = Vec_IntEntry(p->vCis,local_28);
        _i = Gli_ManObj(p,iVar1);
        bVar3 = _i != (Gli_Obj_t *)0x0;
      }
      if (!bVar3) break;
      uVar2 = Gia_ManRandom(0);
      if ((float)(uVar2 & 0xffff) * 1.5258789e-05 < PiTransProb) {
        Vec_IntPush(p->vCisChanged,_i->Handle);
        *(uint *)_i = *(uint *)_i & 0xfffffffd | (*(uint *)_i >> 1 & 1 ^ 1) << 1;
        *(uint *)_i = *(uint *)_i & 0xfffffffb | (*(uint *)_i >> 2 & 1 ^ 1) << 2;
        (_i->field_9).iFanin = (_i->field_9).iFanin + 1;
        (_i->field_10).iFanout = (_i->field_10).iFanout + 1;
      }
      local_28 = local_28 + 1;
    }
    return;
  }
  __assert_fail("0.0 < PiTransProb && PiTransProb < 1.0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaGlitch.c"
                ,0x1b0,"void Gli_ManSetPiRandom(Gli_Man_t *, float)");
}

Assistant:

void Gli_ManSetPiRandom( Gli_Man_t * p, float PiTransProb )
{
    Gli_Obj_t * pObj;
    float Multi = 1.0 / (1 << 16);
    int i;
    assert( 0.0 < PiTransProb && PiTransProb < 1.0 );
    Vec_IntClear( p->vCisChanged );
    Gli_ManForEachCi( p, pObj, i )
        if ( Multi * (Gia_ManRandom(0) & 0xffff) < PiTransProb )
        {
            Vec_IntPush( p->vCisChanged, pObj->Handle );
            pObj->fPhase  ^= 1;
            pObj->fPhase2 ^= 1;
            pObj->nSwitches++;
            pObj->nGlitches++;
        }
}